

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# util.h
# Opt level: O1

tuple<graph,_std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>
* read_model<std::ifstream>
            (tuple<graph,_std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>,_std::vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>_>
             *__return_storage_ptr__,basic_ifstream<char,_std::char_traits<char>_> *stream)

{
  char cVar1;
  char cVar2;
  uint i;
  uint j;
  int r;
  string dummy;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  res;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  volt;
  graph g;
  uint local_bc;
  undefined1 *local_b8;
  undefined8 local_b0;
  undefined1 local_a8;
  undefined7 uStack_a7;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  local_98;
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  local_80;
  graph local_68;
  
  local_b8 = &local_a8;
  local_b0 = 0;
  local_a8 = 0;
  cVar2 = (char)stream;
  cVar1 = std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)stream,(string *)&local_b8,cVar1);
  cVar1 = std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)stream,(string *)&local_b8,cVar1);
  std::istream::operator>>((istream *)stream,(int *)&local_bc);
  cVar1 = std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)stream,(string *)&local_b8,cVar1);
  cVar2 = std::ios::widen((char)*(undefined8 *)(*(long *)stream + -0x18) + cVar2);
  std::getline<char,std::char_traits<char>,std::allocator<char>>
            ((istream *)stream,(string *)&local_b8,cVar2);
  graph::graph(&local_68,local_bc);
  if (local_bc != 0) {
    i = 0;
    do {
      if (local_bc != 0) {
        j = 0;
        do {
          std::istream::_M_extract<bool>((bool *)stream);
          if ((i <= j) &&
             ((char)local_98.
                    super__Vector_base<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
                    ._M_impl.super__Vector_impl_data._M_start == '\x01')) {
            graph::addEdge(&local_68,i,j);
          }
          j = j + 1;
        } while (j != local_bc);
      }
      i = i + 1;
    } while (i != local_bc);
  }
  readMatrix<std::ifstream>(&local_98,stream,local_bc);
  readMatrix<std::ifstream>(&local_80,stream,local_bc);
  std::
  _Tuple_impl<0ul,graph,std::vector<std::vector<float,std::allocator<float>>,std::allocator<std::vector<float,std::allocator<float>>>>,std::vector<std::vector<float,std::allocator<float>>,std::allocator<std::vector<float,std::allocator<float>>>>>
  ::
  _Tuple_impl<graph&,std::vector<std::vector<float,std::allocator<float>>,std::allocator<std::vector<float,std::allocator<float>>>>&,std::vector<std::vector<float,std::allocator<float>>,std::allocator<std::vector<float,std::allocator<float>>>>&,void>
            ((_Tuple_impl<0ul,graph,std::vector<std::vector<float,std::allocator<float>>,std::allocator<std::vector<float,std::allocator<float>>>>,std::vector<std::vector<float,std::allocator<float>>,std::allocator<std::vector<float,std::allocator<float>>>>>
              *)__return_storage_ptr__,&local_68,&local_98,&local_80);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector(&local_80);
  std::
  vector<std::vector<float,_std::allocator<float>_>,_std::allocator<std::vector<float,_std::allocator<float>_>_>_>
  ::~vector(&local_98);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_68.treeAdjMat);
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::~vector(&local_68.adjMatrix);
  if (local_b8 != &local_a8) {
    operator_delete(local_b8,CONCAT71(uStack_a7,local_a8) + 1);
  }
  return __return_storage_ptr__;
}

Assistant:

inline auto read_model(auto &stream){
    std::string dummy;
    std::getline(stream, dummy);
    std::getline(stream, dummy);
    int r;
    stream >> r;
    std::getline(stream, dummy);
    std::getline(stream, dummy);
    graph g(r);
    for (int i = 0;i != r;++i)
        for (int j = 0;j != r;++j){
            bool value;
            stream >> value;
            if(i <= j && value)
                g.addEdge(i,j);
        }
    auto res = readMatrix(stream, r);
    auto volt = readMatrix(stream, r);
    return std::make_tuple(g, res, volt);
}